

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Remote.cpp
# Opt level: O2

bool __thiscall
XPMP2::RmtMsgBufTy<XPMP2::RemoteAcPosUpdateTy,_(XPMP2::RemoteMsgTy)4,_(unsigned_char)'\x00'>::
add_send(RmtMsgBufTy<XPMP2::RemoteAcPosUpdateTy,_(XPMP2::RemoteMsgTy)4,_(unsigned_char)__x00_> *this
        ,RemoteAcPosUpdateTy *_elem,UDPMulticast *_mc)

{
  bool bVar1;
  bool bVar2;
  runtime_error *this_00;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  
  bVar1 = add(this,_elem);
  if (!bVar1) {
    send(this,(int)_mc,__buf,in_RCX,in_R8D);
    bVar2 = add(this,_elem);
    if (!bVar2) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"Could not add new alement after sending/initializing a new message!");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return !bVar1;
}

Assistant:

bool RmtMsgBufTy<ElemTy,MsgTy,msgVer>::add_send (const ElemTy& _elem,
                                                 UDPMulticast& _mc)
{
    if (!add(_elem)) {
        send(_mc);
        if (!add(_elem)) {
            throw std::runtime_error("Could not add new alement after sending/initializing a new message!");
        }
        return true;
    }
    return false;
}